

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

Vec2f __thiscall Model::uv(Model *this,int fi,int li)

{
  Model *pMVar1;
  uint in_ECX;
  undefined4 in_register_00000034;
  long lVar2;
  Vec2f in_XMM0_Qa;
  
  lVar2 = CONCAT44(in_register_00000034,fi);
  if (((-1 < li) && (in_ECX < 3)) &&
     (li < (int)((ulong)(*(long *)(lVar2 + 0x20) - *(long *)(lVar2 + 0x18)) >> 3) * -0x55555555)) {
    pMVar1 = (Model *)((long)*(int *)(*(long *)(*(long *)(lVar2 + 0x18) + (ulong)(uint)li * 0x18) +
                                      4 + (ulong)in_ECX * 0xc) * 8 + *(long *)(lVar2 + 0x48));
    (this->verts).super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (pMVar1 != this) {
      in_XMM0_Qa = (Vec2f)(pMVar1->verts).
                          super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                          super__Vector_impl_data._M_start;
      (this->verts).super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_XMM0_Qa;
    }
    return in_XMM0_Qa;
  }
  __assert_fail("fi>=0 && fi<nfaces() && li>=0 && li<3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Reynault[P]RDV_Projet_Sies_Romary/src/model.cpp"
                ,0x57,"Vec2f Model::uv(int, int)");
}

Assistant:

Vec2f Model::uv(int fi, int li) {
    assert(fi>=0 && fi<nfaces() && li>=0 && li<3);
    return texcoords[faces[fi][li].y];
}